

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * CheckEnvironmentType_abi_cxx11_(string *__return_storage_ptr__,int numOptions,char **argv)

{
  string *psVar1;
  int iVar2;
  allocator<char> *__a;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  allocator<char> local_3a;
  allocator<char> local_39;
  string *local_38;
  
  uVar3 = 0;
  local_38 = __return_storage_ptr__;
  uVar5 = (ulong)(uint)numOptions;
  if (numOptions < 1) {
    uVar5 = uVar3;
  }
  do {
    if (uVar5 == uVar3) {
      pcVar4 = "xytheta";
      __a = &local_3a;
      goto LAB_00106cb6;
    }
    pcVar4 = argv[uVar3 + 1];
    iVar2 = strncmp("--env=",pcVar4,6);
    uVar3 = uVar3 + 1;
  } while (iVar2 != 0);
  pcVar4 = pcVar4 + 6;
  __a = &local_39;
LAB_00106cb6:
  psVar1 = local_38;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar4,__a);
  return psVar1;
}

Assistant:

std::string CheckEnvironmentType(int numOptions, char** argv)
{
    int optionLength = strlen("--env=");
    for (int i = 1; i < numOptions + 1; i++) {
        if (strncmp("--env=", argv[i], optionLength) == 0) {
            std::string s(&argv[i][optionLength]);
            return s;
        }
    }
    return std::string("xytheta");
}